

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV AsymVerifyFinal(Session *session,CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  int iVar1;
  AsymmetricAlgorithm *pAVar2;
  PublicKey *pPVar3;
  CK_ULONG CVar4;
  CK_RV CVar5;
  ByteString signature;
  ByteString local_58;
  
  pAVar2 = Session::getAsymmetricCryptoOp(session);
  pPVar3 = Session::getPublicKey(session);
  if (pAVar2 == (AsymmetricAlgorithm *)0x0 || pPVar3 == (PublicKey *)0x0) {
    Session::resetOp(session);
    CVar5 = 0x91;
  }
  else {
    CVar4 = (**(code **)(*(long *)pPVar3 + 0x28))(pPVar3);
    if (CVar4 == ulSignatureLen) {
      ByteString::ByteString(&local_58,pSignature,ulSignatureLen);
      iVar1 = (*pAVar2->_vptr_AsymmetricAlgorithm[9])(pAVar2,&local_58);
      Session::resetOp(session);
      CVar5 = 0xc0;
      if ((char)iVar1 != '\0') {
        CVar5 = 0;
      }
      local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_58.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
    else {
      softHSMLog(3,"AsymVerifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x166f,"The size of the signature differs from the size of the mechanism");
      Session::resetOp(session);
      CVar5 = 0xc1;
    }
  }
  return CVar5;
}

Assistant:

static CK_RV AsymVerifyFinal(Session* session, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	AsymmetricAlgorithm* asymCrypto = session->getAsymmetricCryptoOp();
	PublicKey* publicKey = session->getPublicKey();
	if (asymCrypto == NULL || publicKey == NULL)
	{
		session->resetOp();
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	// Size of the signature
	CK_ULONG size = publicKey->getOutputLength();

	// Check buffer size
	if (ulSignatureLen != size)
	{
		ERROR_MSG("The size of the signature differs from the size of the mechanism");
		session->resetOp();
		return CKR_SIGNATURE_LEN_RANGE;
	}

	// Get the data
	ByteString signature(pSignature, ulSignatureLen);

	// Verify the data
	if (!asymCrypto->verifyFinal(signature))
	{
		session->resetOp();
		return CKR_SIGNATURE_INVALID;
	}

	session->resetOp();
	return CKR_OK;
}